

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O1

void run_read(cio_buffered_stream *buffered_stream)

{
  cio_read_buffer *read_buffer;
  uint8_t *__src;
  cio_bs_state cVar1;
  cio_error err;
  size_t __n;
  
  do {
    if (buffered_stream->read_job == (_func_cio_bs_state_cio_buffered_stream_ptr *)0x0) {
      return;
    }
    cVar1 = (*buffered_stream->read_job)(buffered_stream);
    if (cVar1 == CIO_BS_CLOSED) {
      return;
    }
  } while (cVar1 != CIO_BS_AGAIN);
  read_buffer = buffered_stream->read_buffer;
  if (read_buffer->end == read_buffer->add_ptr) {
    __src = read_buffer->fetch_ptr;
    if (read_buffer->data == __src) {
      buffered_stream->last_error = CIO_MESSAGE_TOO_LONG;
      (*buffered_stream->read_job)(buffered_stream);
      return;
    }
    __n = (long)read_buffer->add_ptr - (long)__src;
    memmove(read_buffer->data,__src,__n);
    read_buffer->fetch_ptr = read_buffer->data;
    read_buffer->add_ptr = read_buffer->data + __n;
  }
  err = (*buffered_stream->stream->read_some)
                  (buffered_stream->stream,read_buffer,handle_read,buffered_stream);
  if (err == CIO_SUCCESS) {
    return;
  }
  call_handler(buffered_stream,err,read_buffer,0);
  return;
}

Assistant:

static void run_read(struct cio_buffered_stream *buffered_stream)
{
	while (buffered_stream->read_job != NULL) {
		enum cio_bs_state err = buffered_stream->read_job(buffered_stream);
		if (err == CIO_BS_AGAIN) {
			fill_buffer(buffered_stream);
			return;
		}

		if (err == CIO_BS_CLOSED) {
			return;
		}
	}
}